

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Text.cpp
# Opt level: O0

void __thiscall sf::Text::setFillColor(Text *this,Color *color)

{
  bool bVar1;
  size_t sVar2;
  Vertex *pVVar3;
  undefined4 *in_RSI;
  VertexArray *in_RDI;
  size_t i;
  Color *in_stack_ffffffffffffffd8;
  ulong index;
  ulong local_18;
  
  bVar1 = sf::operator!=((Color *)in_RDI,in_stack_ffffffffffffffd8);
  if ((bVar1) &&
     (*(undefined4 *)&in_RDI[6].super_Drawable._vptr_Drawable = *in_RSI,
     (in_RDI[8].m_primitiveType & Lines) == Points)) {
    local_18 = 0;
    while (index = local_18, sVar2 = VertexArray::getVertexCount((VertexArray *)0x21e740),
          index < sVar2) {
      pVVar3 = VertexArray::operator[](in_RDI,index);
      pVVar3->color = *(Color *)&in_RDI[6].super_Drawable._vptr_Drawable;
      local_18 = local_18 + 1;
    }
  }
  return;
}

Assistant:

void Text::setFillColor(const Color& color)
{
    if (color != m_fillColor)
    {
        m_fillColor = color;

        // Change vertex colors directly, no need to update whole geometry
        // (if geometry is updated anyway, we can skip this step)
        if (!m_geometryNeedUpdate)
        {
            for (std::size_t i = 0; i < m_vertices.getVertexCount(); ++i)
                m_vertices[i].color = m_fillColor;
        }
    }
}